

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_overwrite_int64(void)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  bson_t b;
  bson_iter_t iter;
  undefined1 auStack_180 [128];
  undefined1 local_100 [248];
  
  bson_init(auStack_180);
  bVar1 = bson_append_int64(auStack_180,"key",0xffffffff,0x4d2);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x19f,"test_bson_iter_overwrite_int64","bson_append_int64 (&b, \"key\", -1, 1234)");
    abort();
  }
  bVar1 = bson_iter_init_find(local_100,auStack_180,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1a0,"test_bson_iter_overwrite_int64","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 0x12) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1a1,"test_bson_iter_overwrite_int64","BSON_ITER_HOLDS_INT64 (&iter)");
    abort();
  }
  bson_iter_overwrite_int64(local_100,0x1221);
  bVar1 = bson_iter_init_find(local_100,auStack_180,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1a3,"test_bson_iter_overwrite_int64","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 0x12) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1a4,"test_bson_iter_overwrite_int64","BSON_ITER_HOLDS_INT64 (&iter)");
    abort();
  }
  lVar3 = bson_iter_int64(local_100);
  if (lVar3 != 0x1221) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)bson_iter_int64 (&iter) == 4641\n",0x1a5);
    abort();
  }
  bson_destroy(auStack_180);
  return;
}

Assistant:

static void
test_bson_iter_overwrite_int64 (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   BSON_ASSERT (bson_append_int64 (&b, "key", -1, 1234));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   bson_iter_overwrite_int64 (&iter, 4641);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   BSON_ASSERT_CMPINT (bson_iter_int64 (&iter), ==, 4641);
   bson_destroy (&b);
}